

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.h
# Opt level: O2

uint __thiscall
FFlatVertexBuffer::GetCount(FFlatVertexBuffer *this,FFlatVertex *newptr,uint *poffset)

{
  uint uVar1;
  FFlatVertex *pFVar2;
  uint uVar3;
  
  pFVar2 = this->map;
  uVar1 = this->mCurIndex;
  *poffset = uVar1;
  uVar3 = (uint)(((long)newptr - (long)pFVar2) / 0x14);
  this->mCurIndex = uVar3;
  if (0x1e828b < uVar3) {
    this->mCurIndex = this->mIndex;
  }
  return uVar3 - uVar1;
}

Assistant:

unsigned int GetCount(FFlatVertex *newptr, unsigned int *poffset)
	{
		unsigned int newofs = (unsigned int)(newptr - map);
		unsigned int diff = newofs - mCurIndex;
		*poffset = mCurIndex;
		mCurIndex = newofs;
		if (mCurIndex >= BUFFER_SIZE_TO_USE) mCurIndex = mIndex;
		return diff;
	}